

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_GetProperty_NoFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  PropertyId propertyId_00;
  FunctionBody *functionBody;
  InlineCache *inlineCache;
  Var value_00;
  Var value;
  PropertyId propertyId;
  OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  Var instance_local;
  InterpreterStackFrame *this_local;
  
  propertyId_00 = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  functionBody = GetFunctionBody(this);
  inlineCache = GetInlineCache(this,playout->inlineCacheIndex);
  value_00 = Js::JavascriptOperators::PatchGetValue<false,Js::InlineCache>
                       (functionBody,inlineCache,playout->inlineCacheIndex,instance,propertyId_00);
  SetReg<unsigned_int>(this,playout->Value,value_00);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::OP_GetProperty_NoFastPath(Var instance, unaligned T* playout)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);

        Var value = JavascriptOperators::PatchGetValue<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            instance,
            propertyId
            );

#ifdef TELEMETRY_INTERPRETER
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetMethod throws an exception if not found.
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, value, true);
        }
#endif

        SetReg(playout->Value, value);
    }